

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O3

Index Eigen::internal::partial_lu_impl<double,_0,_int>::blocked_lu
                (Index rows,Index cols,double *lu_data,Index luStride,int *row_transpositions,
                int *nb_transpositions,Index maxBlockSize)

{
  ulong uVar1;
  double *pdVar2;
  double *lu_data_00;
  int iVar3;
  long lVar4;
  Index IVar5;
  ulong uVar6;
  ulong cols_00;
  ulong rows_00;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  int nb_transpositions_in_panel;
  BlockType A22;
  BlockType A21;
  BlockType A12;
  int local_3ec;
  ulong local_3e8;
  ulong local_3e0;
  MatrixType local_3d8;
  double *local_398;
  Index IStack_390;
  ulong local_388;
  double *local_378;
  Index IStack_370;
  ulong local_368;
  double *local_358;
  Index IStack_350;
  ulong local_348;
  double *local_338;
  Index IStack_330;
  ulong local_328;
  long local_320;
  long local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  double *local_2f8;
  ulong local_2f0;
  double *local_2e8 [2];
  ulong local_2d8;
  double *local_2d0;
  Index local_2c8;
  ulong local_2c0;
  double *local_2b8;
  Index IStack_2b0;
  ulong local_2a8;
  double *local_2a0;
  Index IStack_298;
  ulong local_290;
  Index local_280;
  Index local_278;
  undefined8 local_270;
  double *local_268;
  Index IStack_260;
  ulong local_258;
  double *local_248;
  Index IStack_240;
  ulong local_238;
  undefined1 local_228 [80];
  Index IStack_1d8;
  ulong local_1d0;
  variable_if_dynamic<long,__1> local_1c0;
  variable_if_dynamic<long,__1> local_1b8;
  PointerType local_1b0;
  double *local_168;
  Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>
  local_150;
  Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>
  local_f0;
  double *local_90;
  ulong local_88;
  ulong local_80;
  double *local_78;
  Index IStack_70;
  ulong local_68;
  double *local_60;
  Index IStack_58;
  ulong local_50;
  Index local_40;
  Index local_38;
  
  if ((luStride | cols) < 0 && lu_data != (double *)0x0) {
    pcVar8 = 
    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>>, Level = 0]"
    ;
  }
  else {
    local_3d8.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_data = lu_data;
    local_3d8.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_rows.m_value = rows;
    local_3d8.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
    .m_cols.m_value = cols;
    if (-1 < (cols | rows) || lu_data == (double *)0x0) {
      local_3d8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = lu_data;
      local_3d8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = luStride;
      local_3d8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = cols;
      local_3d8.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_outerStride = luStride;
      if (((rows < 0) || (cols < 0)) || (luStride < rows)) {
        pcVar8 = 
        "Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Map<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
        ;
LAB_0010ac2a:
        __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/Block.h"
                      ,0x8d,pcVar8);
      }
      uVar10 = rows;
      if ((ulong)cols < (ulong)rows) {
        uVar10 = cols;
      }
      if (uVar10 < 0x11) {
        lVar4 = unblocked_lu(&local_3d8,row_transpositions,nb_transpositions);
      }
      else {
        uVar6 = uVar10 >> 3 & 0xffffffffffffff0;
        local_300 = 8;
        if (uVar6 != 0) {
          local_300 = uVar6;
        }
        local_310 = maxBlockSize;
        if ((long)local_300 < maxBlockSize) {
          local_310 = local_300;
        }
        *nb_transpositions = 0;
        local_318 = local_310 * 8;
        local_320 = luStride * 8;
        lVar4 = -1;
        uVar6 = 0;
        pdVar13 = lu_data;
        local_3e8 = cols;
        local_308 = uVar10;
        do {
          uVar11 = maxBlockSize;
          if ((long)local_300 < maxBlockSize) {
            uVar11 = local_300;
          }
          if ((long)uVar10 <= (long)uVar11) {
            uVar11 = uVar10;
          }
          uVar9 = local_308 - uVar6;
          cols_00 = uVar9;
          if ((long)local_310 < (long)uVar9) {
            cols_00 = local_310;
          }
          if ((long)(uVar6 | rows) < 0 && lu_data != (double *)0x0) goto LAB_0010abf6;
          local_328 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_cols.m_value;
          local_338 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_data;
          IStack_330 = local_3d8.
                       super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                       .m_rows.m_value;
          local_358 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
          IStack_350 = local_3d8.
                       super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .m_xpr.
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_rows.m_value;
          local_348 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_cols.m_value;
          if ((ulong)cols < uVar6) {
LAB_0010ac15:
            pcVar8 = 
            "Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
            ;
            goto LAB_0010ac2a;
          }
          uVar9 = uVar9 - cols_00;
          uVar1 = cols_00 + uVar6;
          pdVar2 = lu_data + uVar1 * luStride;
          if (((long)(uVar9 | rows) < 0) && (pdVar2 != (double *)0x0)) goto LAB_0010abf6;
          local_368 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_cols.m_value;
          local_378 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_data;
          IStack_370 = local_3d8.
                       super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                       .m_rows.m_value;
          local_398 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
          IStack_390 = local_3d8.
                       super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .m_xpr.
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_rows.m_value;
          local_388 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_cols.m_value;
          if (((long)(uVar9 | uVar1) < 0) || ((long)(cols - uVar9) < (long)uVar1))
          goto LAB_0010ac15;
          lu_data_00 = lu_data + uVar6 * luStride + uVar6;
          if (((long)cols_00 < 0) && (lu_data_00 != (double *)0x0)) goto LAB_0010abf6;
          local_238 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_cols.m_value;
          local_248 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_data;
          IStack_240 = local_3d8.
                       super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                       .m_rows.m_value;
          local_268 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
          IStack_260 = local_3d8.
                       super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                       .m_xpr.
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_rows.m_value;
          local_258 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_cols.m_value;
          if (((long)(cols_00 | uVar6) < 0) ||
             (((long)(rows - cols_00) < (long)uVar6 || ((long)(cols - cols_00) < (long)uVar6))))
          goto LAB_0010ac15;
          local_90 = pdVar2 + uVar6;
          local_3e0 = uVar9;
          local_88 = cols_00;
          local_80 = uVar9;
          if (((long)(uVar9 | cols_00) < 0) && (local_90 != (double *)0x0)) {
LAB_0010abf6:
            pcVar8 = 
            "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, Level = 0]"
            ;
            goto LAB_0010ac0b;
          }
          rows_00 = rows - uVar6;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value = rows_00 - cols_00;
          local_68 = local_3d8.
                     super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                     .m_cols.m_value;
          local_78 = local_3d8.
                     super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                     .m_data;
          IStack_70 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                      .m_rows.m_value;
          local_50 = local_3d8.
                     super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                     .m_xpr.
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_cols.m_value;
          local_60 = local_3d8.
                     super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                     .m_xpr.
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data;
          IStack_58 = local_3d8.
                      super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                      .m_xpr.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_rows.m_value;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_data = lu_data + uVar6 * luStride + uVar1;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value = cols_00;
          local_40 = luStride;
          local_38 = luStride;
          if (((long)(local_f0.
                      super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
                      .m_rows.m_value | cols_00) < 0) &&
             (local_f0.
              super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
              .m_data != (double *)0x0)) goto LAB_0010abf6;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
          .m_cols.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
               .m_cols.m_value;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
          .m_data = local_3d8.
                    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                    .m_data;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
          .m_rows.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
               .m_rows.m_value;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .m_xpr.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_3d8.
                    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .m_xpr.
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .m_xpr.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_outerStride = luStride;
          local_f0.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_outerStride = luStride;
          if (((long)(local_f0.
                      super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
                      .m_rows.m_value | uVar1) < 0) ||
             (rows - local_f0.
                     super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
                     .m_rows.m_value < (long)uVar1)) goto LAB_0010ac15;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_data = pdVar2 + uVar1;
          local_2f0 = uVar10;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value =
               local_f0.
               super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
               .m_rows.m_value;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
          .m_cols.m_value = uVar9;
          if (((long)(local_f0.
                      super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
                      .m_rows.m_value | uVar9) < 0) &&
             (local_150.
              super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
              .m_data != (double *)0x0)) goto LAB_0010abf6;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
          .m_cols.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
               .m_cols.m_value;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
          .m_data = local_3d8.
                    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                    .m_data;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
          .m_rows.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
               .m_rows.m_value;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .m_xpr.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_3d8.
                    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                    .m_xpr.
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_xpr.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_3d8.
               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
               .m_xpr.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_xpr.
          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
          .m_outerStride = luStride;
          local_150.
          super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
          .m_outerStride = luStride;
          IVar5 = blocked_lu(rows_00,cols_00,lu_data_00,luStride,row_transpositions + uVar6,
                             &local_3ec,0x10);
          lVar7 = IVar5 + uVar6;
          if (lVar4 != -1) {
            lVar7 = lVar4;
          }
          if (IVar5 < 0) {
            lVar7 = lVar4;
          }
          lVar4 = lVar7;
          *nb_transpositions = *nb_transpositions + local_3ec;
          local_2f8 = pdVar13;
          if ((long)cols_00 < 1) {
            cols = local_3e8;
            if (rows_00 != cols_00) goto LAB_0010aa97;
          }
          else {
            pdVar12 = (double *)((uVar11 + uVar6) * local_320 + (long)pdVar13);
            uVar10 = uVar6;
            do {
              iVar3 = row_transpositions[uVar10] + (int)uVar6;
              row_transpositions[uVar10] = iVar3;
              local_228._64_8_ = local_328;
              local_228._48_8_ = local_338;
              local_228._56_8_ = IStack_330;
              local_1d0 = local_348;
              local_228._72_8_ = local_358;
              IStack_1d8 = IStack_350;
              local_1b0 = (PointerType)0x1;
              local_228._0_8_ = pdVar13;
              local_228._24_8_ = lu_data;
              local_228._40_8_ = uVar6;
              if (rows <= (long)uVar10) goto LAB_0010abc0;
              local_2e8[0] = lu_data + iVar3;
              local_2a8 = local_328;
              local_2b8 = local_338;
              IStack_2b0 = IStack_330;
              local_290 = local_348;
              local_2a0 = local_358;
              IStack_298 = IStack_350;
              local_270 = 1;
              local_2d8 = uVar6;
              local_2d0 = lu_data;
              local_2c8 = rows;
              local_2c0 = uVar6;
              local_280 = luStride;
              local_278 = luStride;
              local_228._24_8_ = lu_data;
              if ((iVar3 < 0) || (local_2d0 = lu_data, local_228._24_8_ = lu_data, rows <= iVar3))
              goto LAB_0010abc0;
              local_2d0 = lu_data;
              local_228._16_8_ = uVar6;
              local_228._24_8_ = lu_data;
              local_228._32_8_ = rows;
              local_1c0.m_value = luStride;
              local_1b8.m_value = luStride;
              DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,1,-1,false>>
              ::
              swap<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,1,_1,false>>
                        ((DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,1,_1,false>>
                          *)local_228,
                         (DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1,__1,_false>_>
                          *)local_2e8,0);
              cols = local_3e8;
              uVar10 = uVar10 + 1;
              pdVar13 = pdVar13 + 1;
            } while ((long)uVar10 < (long)uVar1);
            if (rows_00 != cols_00) {
              uVar10 = uVar6;
              if (0 < (long)cols_00) {
                do {
                  local_228._16_8_ = local_3e0;
                  local_228._0_8_ = pdVar12;
                  if (((long)local_3e0 < 0) && (pdVar12 != (double *)0x0)) {
LAB_0010abdf:
                    pcVar8 = 
                    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, 1>, Level = 0]"
                    ;
                    goto LAB_0010ac0b;
                  }
                  local_228._40_8_ = local_3e0;
                  local_228._64_8_ = local_368;
                  local_228._48_8_ = local_378;
                  local_228._56_8_ = IStack_370;
                  local_1d0 = local_388;
                  local_228._72_8_ = local_398;
                  IStack_1d8 = IStack_390;
                  local_1b0 = (PointerType)0x1;
                  local_228._24_8_ = pdVar2;
                  if ((ulong)rows <= uVar10) {
LAB_0010abc0:
                    local_1b0 = (PointerType)0x1;
                    local_228._16_8_ = local_228._40_8_;
                    local_228._32_8_ = rows;
                    local_1c0.m_value = luStride;
                    local_1b8.m_value = luStride;
                    __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/Block.h"
                                  ,0x76,
                                  "Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                                 );
                  }
                  iVar3 = row_transpositions[uVar10];
                  local_2e8[0] = pdVar2 + iVar3;
                  local_2d8 = local_3e0;
                  if (((long)local_3e0 < 0) &&
                     (local_228._32_8_ = rows, local_1c0.m_value = luStride,
                     local_1b8.m_value = luStride, local_2e8[0] != (double *)0x0))
                  goto LAB_0010abdf;
                  local_2c0 = local_3e0;
                  local_2a8 = local_368;
                  local_2b8 = local_378;
                  IStack_2b0 = IStack_370;
                  local_290 = local_388;
                  local_2a0 = local_398;
                  IStack_298 = IStack_390;
                  local_270 = 1;
                  local_2d0 = pdVar2;
                  local_2c8 = rows;
                  local_280 = luStride;
                  local_278 = luStride;
                  if ((iVar3 < 0) || (rows <= iVar3)) goto LAB_0010abc0;
                  local_228._32_8_ = rows;
                  local_1c0.m_value = luStride;
                  local_1b8.m_value = luStride;
                  DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,1,-1,false>>
                  ::
                  swap<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,1,_1,false>>
                            ((DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,1,_1,false>>
                              *)local_228,
                             (DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1,__1,_false>_>
                              *)local_2e8,0);
                  uVar10 = uVar10 + 1;
                  pdVar12 = pdVar12 + 1;
                } while ((long)uVar10 < (long)uVar1);
              }
LAB_0010aa97:
              local_228._40_8_ = local_238;
              local_228._24_8_ = local_248;
              local_228._32_8_ = IStack_240;
              local_228._64_8_ = local_258;
              local_228._48_8_ = local_268;
              local_228._56_8_ = IStack_260;
              local_228._0_8_ = lu_data_00;
              local_228._8_8_ = cols_00;
              local_228._16_8_ = cols_00;
              IStack_1d8 = luStride;
              local_1d0 = luStride;
              TriangularView<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,5u>
              ::
              solveInPlace<1,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>>
                        ((TriangularView<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,5u>
                          *)local_228,
                         (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>_>
                          *)&local_90);
              ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>,_5>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>_>
              ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_5>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>_>
                             *)local_228,&local_f0,
                            (Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>
                             *)&local_90);
              local_2e8[0] = (double *)0xbff0000000000000;
              GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,5>
              ::
              scaleAndAddTo<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>>
                        ((GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,5>
                          *)local_228,&local_150,(Scalar *)local_2e8);
              free(local_168);
            }
          }
          uVar6 = uVar6 + local_310;
          pdVar13 = (double *)((long)local_2f8 + local_318);
          uVar10 = local_2f0 - local_310;
        } while ((long)uVar6 < (long)local_308);
      }
      return lVar4;
    }
    pcVar8 = 
    "Eigen::MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, Level = 0]"
    ;
  }
LAB_0010ac0b:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/MapBase.h"
                ,0x94,pcVar8);
}

Assistant:

static Index blocked_lu(Index rows, Index cols, Scalar* lu_data, Index luStride, PivIndex* row_transpositions, PivIndex& nb_transpositions, Index maxBlockSize=256)
  {
    MapLU lu1(lu_data,StorageOrder==RowMajor?rows:luStride,StorageOrder==RowMajor?luStride:cols);
    MatrixType lu(lu1,0,0,rows,cols);

    const Index size = (std::min)(rows,cols);

    // if the matrix is too small, no blocking:
    if(size<=16)
    {
      return unblocked_lu(lu, row_transpositions, nb_transpositions);
    }

    // automatically adjust the number of subdivisions to the size
    // of the matrix so that there is enough sub blocks:
    Index blockSize;
    {
      blockSize = size/8;
      blockSize = (blockSize/16)*16;
      blockSize = (std::min)((std::max)(blockSize,Index(8)), maxBlockSize);
    }

    nb_transpositions = 0;
    Index first_zero_pivot = -1;
    for(Index k = 0; k < size; k+=blockSize)
    {
      Index bs = (std::min)(size-k,blockSize); // actual size of the block
      Index trows = rows - k - bs; // trailing rows
      Index tsize = size - k - bs; // trailing size

      // partition the matrix:
      //                          A00 | A01 | A02
      // lu  = A_0 | A_1 | A_2 =  A10 | A11 | A12
      //                          A20 | A21 | A22
      BlockType A_0(lu,0,0,rows,k);
      BlockType A_2(lu,0,k+bs,rows,tsize);
      BlockType A11(lu,k,k,bs,bs);
      BlockType A12(lu,k,k+bs,bs,tsize);
      BlockType A21(lu,k+bs,k,trows,bs);
      BlockType A22(lu,k+bs,k+bs,trows,tsize);

      PivIndex nb_transpositions_in_panel;
      // recursively call the blocked LU algorithm on [A11^T A21^T]^T
      // with a very small blocking size:
      Index ret = blocked_lu(trows+bs, bs, &lu.coeffRef(k,k), luStride,
                   row_transpositions+k, nb_transpositions_in_panel, 16);
      if(ret>=0 && first_zero_pivot==-1)
        first_zero_pivot = k+ret;

      nb_transpositions += nb_transpositions_in_panel;
      // update permutations and apply them to A_0
      for(Index i=k; i<k+bs; ++i)
      {
        Index piv = (row_transpositions[i] += k);
        A_0.row(i).swap(A_0.row(piv));
      }

      if(trows)
      {
        // apply permutations to A_2
        for(Index i=k;i<k+bs; ++i)
          A_2.row(i).swap(A_2.row(row_transpositions[i]));

        // A12 = A11^-1 A12
        A11.template triangularView<UnitLower>().solveInPlace(A12);

        A22.noalias() -= A21 * A12;
      }
    }
    return first_zero_pivot;
  }